

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbtsub.c
# Opt level: O2

void bltchar(LispPTR *args)

{
  DLword *ybase;
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  ulong uVar4;
  LispPTR *pLVar5;
  LispPTR *pLVar6;
  sbyte sVar7;
  uint uVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  ushort uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  ushort uVar18;
  ushort uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  int w;
  uint uVar24;
  uint *puVar25;
  uint *puVar26;
  uint *puVar27;
  uint *puVar28;
  int local_9c;
  uint local_88;
  uint local_78;
  uint local_74;
  uint local_70;
  sbyte sVar8;
  
  pLVar5 = NativeAligned4FromLAddr(*args & 0xfffffff);
  pLVar6 = NativeAligned4FromLAddr(args[1] & 0xfffffff);
  uVar1 = (ushort)pLVar5[3];
  uVar13 = -uVar1;
  if (0 < (short)uVar1) {
    uVar13 = uVar1;
  }
  uVar1 = (ushort)pLVar5[1];
  uVar18 = -uVar1;
  if (0 < (short)uVar1) {
    uVar18 = uVar1;
  }
  uVar1 = (ushort)pLVar5[4];
  if (uVar1 != 0) {
    uVar4 = *(ulong *)(args + 4);
    uVar9 = (uint)uVar4 & 0xffff;
    w = ((uint)(uVar4 >> 0x20) & 0xffff) - uVar9;
    if (0 < w) {
      ybase = Lisp_world + ((ulong)*(ushort *)((long)pLVar5 + 2) | (ulong)(*pLVar5 << 0x10));
      uVar2 = *(ushort *)((long)pLVar5 + 0x16);
      uVar19 = uVar2 >> 9 & 3;
      uVar12 = (ulong)(uVar9 >> 3) + (long)ybase;
      puVar26 = (uint *)(uVar12 & 0xfffffffffffffffc);
      uVar15 = ((uint)uVar4 & 7) + ((uint)uVar12 & 3) * 8;
      local_70 = (w + uVar15) - 1 & 0x1f;
      uVar20 = -(uint)(uVar15 == 0) | ~(-1 << (-(char)uVar15 & 0x1fU));
      local_88 = -1 << (~(byte)local_70 & 0x1f);
      uVar9 = (*(ushort *)
                ((ulong)(Lisp_world + (((uint)*(undefined8 *)(args + 2) & 0xffff) + pLVar6[9])) ^ 2)
              + uVar9) - ((uint)((ulong)*(undefined8 *)(args + 2) >> 0x20) & 0xffff);
      ScreenLocked = 1;
      if ((int)uVar9 < 0) {
        uVar12 = -(ulong)(7 - uVar9 >> 3);
      }
      else {
        uVar12 = (ulong)(uVar9 >> 3);
      }
      uVar12 = (long)Lisp_world +
               uVar12 + ((ulong)*(ushort *)((long)pLVar5 + 10) | (ulong)(pLVar5[2] << 0x10)) * 2;
      local_74 = local_88 & uVar20;
      local_9c = (w + uVar15 >> 5) - 1;
      uVar9 = (uVar9 & 7) + ((uint)uVar12 & 3) * 8;
      uVar21 = uVar9 - uVar15 & 0x1f;
      uVar24 = 0;
      uVar17 = -(uint)(uVar21 == 0) | ~(-1 << (sbyte)uVar21);
      uVar22 = uVar15 - uVar9 & 0x1f;
      local_78 = w + uVar9 + 0x1f & 0x1f;
      puVar28 = (uint *)(uVar12 & 0xfffffffffffffffc);
      uVar10 = -(uVar2 >> 0xb & 1);
      for (uVar16 = (uint)uVar1; 0 < (int)uVar16; uVar16 = uVar16 - 1) {
        uVar23 = *puVar28;
        sVar7 = (sbyte)uVar22;
        sVar8 = (sbyte)uVar21;
        if ((uVar15 < uVar9) && (0x20 - w < (int)uVar9)) {
          puVar25 = puVar28 + 2;
          uVar14 = puVar28[1] >> sVar7 & uVar17 | uVar23 << sVar8;
          uVar24 = puVar28[1] << sVar8 & ~uVar17;
        }
        else {
          puVar25 = puVar28 + 1;
          if (uVar15 < uVar9) {
            uVar14 = uVar23 << sVar8;
          }
          else {
            uVar14 = uVar23 >> sVar7 & uVar17;
            uVar24 = uVar23 << sVar8 & ~uVar17;
          }
        }
        uVar14 = uVar14 ^ uVar10;
        puVar27 = puVar26;
        uVar23 = local_74;
        if ((int)uVar15 < 0x21 - w) {
LAB_0010d9ac:
          uVar3 = *puVar27;
          switch(uVar19) {
          case 1:
            uVar14 = uVar14 & uVar3;
            break;
          case 2:
            uVar14 = uVar14 | uVar3;
            break;
          case 3:
            uVar14 = uVar14 ^ uVar3;
          }
          *puVar27 = uVar3 & ~uVar23 | uVar14 & uVar23;
        }
        else {
          uVar23 = *puVar26;
          switch(uVar19) {
          case 1:
            uVar14 = uVar14 & uVar23;
            break;
          case 2:
            uVar14 = uVar14 | uVar23;
            break;
          case 3:
            uVar14 = uVar14 ^ uVar23;
          }
          *puVar26 = uVar14 & uVar20 | uVar23 & ~uVar20;
          puVar27 = puVar26 + 1;
          if (uVar9 == uVar15) {
            if ((uVar2 >> 0xb & 1) == 0) {
              switch(uVar19) {
              case 0:
                for (iVar11 = local_9c; 0 < iVar11; iVar11 = iVar11 + -1) {
                  uVar23 = *puVar25;
                  puVar25 = puVar25 + 1;
                  *puVar27 = uVar23;
                  puVar27 = puVar27 + 1;
                }
                break;
              case 1:
                for (iVar11 = local_9c; 0 < iVar11; iVar11 = iVar11 + -1) {
                  uVar23 = *puVar25;
                  puVar25 = puVar25 + 1;
                  *puVar27 = *puVar27 & uVar23;
                  puVar27 = puVar27 + 1;
                }
                break;
              case 2:
                for (iVar11 = local_9c; 0 < iVar11; iVar11 = iVar11 + -1) {
                  uVar23 = *puVar25;
                  puVar25 = puVar25 + 1;
                  *puVar27 = *puVar27 | uVar23;
                  puVar27 = puVar27 + 1;
                }
                break;
              case 3:
                for (iVar11 = local_9c; 0 < iVar11; iVar11 = iVar11 + -1) {
                  uVar23 = *puVar25;
                  puVar25 = puVar25 + 1;
                  *puVar27 = *puVar27 ^ uVar23;
                  puVar27 = puVar27 + 1;
                }
              }
            }
            else {
              switch(uVar19) {
              case 0:
                for (iVar11 = local_9c; 0 < iVar11; iVar11 = iVar11 + -1) {
                  uVar23 = *puVar25;
                  puVar25 = puVar25 + 1;
                  *puVar27 = ~uVar23;
                  puVar27 = puVar27 + 1;
                }
                break;
              case 1:
                for (iVar11 = local_9c; 0 < iVar11; iVar11 = iVar11 + -1) {
                  uVar23 = *puVar25;
                  puVar25 = puVar25 + 1;
                  *puVar27 = *puVar27 & ~uVar23;
                  puVar27 = puVar27 + 1;
                }
                break;
              case 2:
                for (iVar11 = local_9c; 0 < iVar11; iVar11 = iVar11 + -1) {
                  uVar23 = *puVar25;
                  puVar25 = puVar25 + 1;
                  *puVar27 = *puVar27 | ~uVar23;
                  puVar27 = puVar27 + 1;
                }
                break;
              case 3:
                for (iVar11 = local_9c; 0 < iVar11; iVar11 = iVar11 + -1) {
                  uVar23 = *puVar25;
                  puVar25 = puVar25 + 1;
                  *puVar27 = ~(uVar23 ^ *puVar27);
                  puVar27 = puVar27 + 1;
                }
              }
            }
          }
          else if ((uVar2 >> 0xb & 1) == 0) {
            switch(uVar19) {
            case 0:
              for (iVar11 = local_9c; 0 < iVar11; iVar11 = iVar11 + -1) {
                uVar23 = *puVar25;
                puVar25 = puVar25 + 1;
                *puVar27 = uVar23 >> sVar7 | uVar24;
                puVar27 = puVar27 + 1;
                uVar24 = uVar23 << sVar8;
              }
              break;
            case 1:
              for (iVar11 = local_9c; 0 < iVar11; iVar11 = iVar11 + -1) {
                uVar23 = *puVar25;
                *puVar27 = *puVar27 & (uVar23 >> sVar7 | uVar24);
                puVar25 = puVar25 + 1;
                puVar27 = puVar27 + 1;
                uVar24 = uVar23 << sVar8;
              }
              break;
            case 2:
              for (iVar11 = local_9c; 0 < iVar11; iVar11 = iVar11 + -1) {
                uVar23 = *puVar25;
                puVar25 = puVar25 + 1;
                *puVar27 = uVar23 >> sVar7 | *puVar27 | uVar24;
                puVar27 = puVar27 + 1;
                uVar24 = uVar23 << sVar8;
              }
              break;
            case 3:
              for (iVar11 = local_9c; 0 < iVar11; iVar11 = iVar11 + -1) {
                uVar23 = *puVar25;
                *puVar27 = *puVar27 ^ (uVar23 >> sVar7 | uVar24);
                puVar25 = puVar25 + 1;
                puVar27 = puVar27 + 1;
                uVar24 = uVar23 << sVar8;
              }
            }
          }
          else {
            switch(uVar19) {
            case 0:
              for (iVar11 = local_9c; 0 < iVar11; iVar11 = iVar11 + -1) {
                uVar23 = *puVar25;
                puVar25 = puVar25 + 1;
                uVar14 = uVar23 >> sVar7 | uVar24;
                uVar24 = uVar23 << sVar8;
                *puVar27 = ~uVar14;
                puVar27 = puVar27 + 1;
              }
              break;
            case 1:
              for (iVar11 = local_9c; 0 < iVar11; iVar11 = iVar11 + -1) {
                uVar23 = *puVar25 >> sVar7 | uVar24;
                uVar24 = *puVar25 << sVar8;
                *puVar27 = *puVar27 & ~uVar23;
                puVar25 = puVar25 + 1;
                puVar27 = puVar27 + 1;
              }
              break;
            case 2:
              for (iVar11 = local_9c; 0 < iVar11; iVar11 = iVar11 + -1) {
                uVar23 = *puVar25 >> sVar7 | uVar24;
                uVar24 = *puVar25 << sVar8;
                *puVar27 = *puVar27 | ~uVar23;
                puVar25 = puVar25 + 1;
                puVar27 = puVar27 + 1;
              }
              break;
            case 3:
              for (iVar11 = local_9c; 0 < iVar11; iVar11 = iVar11 + -1) {
                uVar23 = *puVar25;
                puVar25 = puVar25 + 1;
                *puVar27 = ~((uVar23 >> sVar7 | uVar24) ^ *puVar27);
                puVar27 = puVar27 + 1;
                uVar24 = uVar23 << sVar8;
              }
            }
          }
          if (local_70 != 0x1f) {
            uVar14 = uVar24;
            if (local_78 <= local_70) {
              uVar14 = *puVar25 >> sVar7 & uVar17 | uVar24;
            }
            uVar14 = uVar14 ^ uVar10;
            uVar23 = local_88;
            goto LAB_0010d9ac;
          }
        }
        uVar23 = (uint)uVar13;
        uVar14 = (uint)uVar18;
        if (((uVar18 | uVar13) & 0x1f) != 0) {
          uVar14 = uVar15 + uVar18;
          uVar15 = uVar14 & 0x1f;
          local_70 = (uVar15 + w) - 1 & 0x1f;
          uVar20 = -(uint)(uVar15 == 0) | ~(-1 << (-(char)uVar15 & 0x1fU));
          local_88 = -1 << (~(byte)local_70 & 0x1f);
          local_74 = local_88 & uVar20;
          local_9c = (uVar15 + w >> 5) - 1;
          uVar23 = uVar9 + uVar13;
          uVar9 = uVar23 & 0x1f;
          local_78 = w + 0x1f + uVar23 & 0x1f;
          uVar22 = uVar14 - uVar23 & 0x1f;
          uVar21 = uVar23 - uVar14 & 0x1f;
          uVar17 = -(uint)(uVar21 == 0) | ~(-1 << (sbyte)uVar21);
        }
        puVar26 = puVar26 + (uVar14 >> 5);
        puVar28 = puVar28 + (uVar23 >> 5);
      }
      if ((DisplayRegion68k <= ybase) && (ybase <= DISP_MAX_Address)) {
        flush_display_lineregion(uVar4 & 0xffff,ybase,w,(uint)uVar1);
      }
      ScreenLocked = 0;
    }
  }
  return;
}

Assistant:

void bltchar(LispPTR *args)
/*      args[0] :       PILOTBBT
 *      args[1] :       DISPLAYDATA
 *      args[2] :       CHAR8CODE
 *      args[3] :       CURX
 *      args[4] :       LEFT
 *      args[5] :       RIGHT
 */
{
  PILOTBBT *pbt;
  DISPLAYDATA *dspdata;
  int base;
#ifdef REALCURSOR
  int displayflg;
#endif
  int w, h;
  int backwardflg = 0, sx, dx, srcbpl, dstbpl, src_comp, op;
  DLword *srcbase, *dstbase;
  int gray = 0;
#ifdef NEWBITBLT
  int num_gray = 0, curr_gray_line = 0;
#endif

  pbt = (PILOTBBT *)NativeAligned4FromLAddr(((BLTC *)args)->pilotbbt);
  dspdata = (DISPLAYDATA *)NativeAligned4FromLAddr(((BLTC *)args)->displaydata);

  srcbase = (DLword *)NativeAligned2FromLAddr(VAG2(pbt->pbtsourcehi, pbt->pbtsourcelo));

  dstbase = (DLword *)NativeAligned2FromLAddr(VAG2(pbt->pbtdesthi, pbt->pbtdestlo));

  srcbpl = abs(pbt->pbtsourcebpl);
  dstbpl = abs(pbt->pbtdestbpl);
  h = pbt->pbtheight;
  w = ((BLTC *)args)->right - ((BLTC *)args)->left;
  if ((h <= 0) || (w <= 0)) return;

  base = GETWORD(NativeAligned2FromLAddr(dspdata->ddoffsetscache + ((BLTC *)args)->char8code));
  sx = base + ((BLTC *)args)->left - ((BLTC *)args)->curx;
  dx = ((BLTC *)args)->left;

#ifdef REALCURSOR
  /* if displayflg != 0 then source or destination is DisplayBitMap
   * Now we consider about only destination
   */
  displayflg = cursorin(pbt->pbtdesthi, (pbt->pbtdestlo + (((BLTC *)args)->left >> 4)),
                        (((BLTC *)args)->right - ((BLTC *)args)->left), pbt->pbtheight, pbt->pbtbackward);
#endif /* REALCURSOR */

  op = pbt->pbtoperation;
  src_comp = pbt->pbtsourcetype;

  LOCKSCREEN;

#ifdef REALCURSOR
  if (displayflg) HideCursor;
#endif /* REALCURSOR */

#ifdef NEWBITBLT
  bitblt(srcbase, dstbase, sx, dx, w, h, srcbpl, dstbpl, backwardflg, src_comp, op, gray, num_gray,
         curr_gray_line);
#else
  new_char_bitblt_code;
#endif

#ifdef DISPLAYBUFFER
#ifdef COLOR
  if (MonoOrColor == MONO_SCREEN)
#endif /* COLOR */

    if (in_display_segment(dstbase)) { flush_display_lineregion(dx, dstbase, w, h); }
#endif

#ifdef XWINDOW
  if (in_display_segment(dstbase)) flush_display_lineregion(dx, dstbase, w, h);
#endif /* XWINDOW */

#ifdef SDL
  if (in_display_segment(dstbase)) flush_display_lineregion(dx, dstbase, w, h);
#endif /* SDL */

#ifdef DOS
  if (in_display_segment(dstbase)) flush_display_lineregion(dx, dstbase, w, h);
#endif /* DOS */

#ifdef REALCURSOR
  if (displayflg) ShowCursor;
#endif /* REALCURSOR */

  UNLOCKSCREEN;
}